

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int compare_files(char *original,char *generated)

{
  uint local_48;
  char local_42;
  char local_41;
  int i;
  char ch2;
  char ch1;
  long sz_generated;
  long sz_original;
  FILE *fp_generated;
  FILE *fp_original;
  char *generated_local;
  char *original_local;
  
  fp_original = (FILE *)generated;
  generated_local = original;
  log_info("compare_files","%-40s %s\n",original,generated);
  fp_generated = bin_open_read(generated_local);
  sz_original = (long)bin_open_read((char *)fp_original);
  fseek((FILE *)fp_generated,0,2);
  sz_generated = ftell((FILE *)fp_generated);
  rewind((FILE *)fp_generated);
  fseek((FILE *)sz_original,0,2);
  _i = ftell((FILE *)sz_original);
  rewind((FILE *)sz_original);
  if (sz_generated == _i) {
    for (local_48 = 0; (int)local_48 < sz_generated; local_48 = local_48 + 1) {
      fread(&local_41,1,1,(FILE *)fp_generated);
      fread(&local_42,1,1,(FILE *)sz_original);
      if (local_41 != local_42) {
        log_error("compare_files",
                  "different byte found at position (%x). original 0x%02X != generated 0x%02X\n",
                  (ulong)local_48,(ulong)(uint)(int)local_41,(ulong)(uint)(int)local_42);
        return 1;
      }
    }
    original_local._4_4_ = 0;
  }
  else {
    log_error("compare_files","different file size:  %s (%ld byte) != %s (%ld byte)\n",
              generated_local,sz_generated,fp_original,_i);
    original_local._4_4_ = 1;
  }
  return original_local._4_4_;
}

Assistant:

int compare_files(const char *original, const char *generated) {
    log_info("compare_files", "%-40s %s\n", original, generated);

    FILE* fp_original = bin_open_read(original);
    FILE* fp_generated = bin_open_read(generated);

    // obtain file size:
    fseek (fp_original, 0, SEEK_END);

    long sz_original = ftell (fp_original);
    rewind (fp_original);

    // obtain file size:
    fseek (fp_generated, 0, SEEK_END);
    long sz_generated = ftell (fp_generated);
    rewind (fp_generated);

    if (sz_original != sz_generated) {
        log_error("compare_files", "different file size:  %s (%ld byte) != %s (%ld byte)\n", original, sz_original, generated, sz_generated);
        return RC_FAIL;
    }

    char ch1, ch2;
    for (int i=0; i<sz_original; i++) {
        fread(&ch1, 1, 1, fp_original);
        fread(&ch2, 1, 1, fp_generated);
        if (ch1 != ch2) {
            log_error("compare_files", "different byte found at position (%x). original 0x%02X != generated 0x%02X\n", i , ch1, ch2);
            return RC_FAIL;
        }
    }
    return RC_OK;
}